

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall cfd::api::json::XpubData::ConvertFromStruct(XpubData *this,XpubDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->base58_);
  std::__cxx11::string::_M_assign((string *)&this->hex_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void XpubData::ConvertFromStruct(
    const XpubDataStruct& data) {
  base58_ = data.base58;
  hex_ = data.hex;
  ignore_items = data.ignore_items;
}